

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# microtar.c
# Opt level: O0

char * mtar_strerror(int err)

{
  char *pcStack_10;
  int err_local;
  
  switch(err) {
  case 0:
    pcStack_10 = "success";
    break;
  case -10:
    pcStack_10 = "file too large";
    break;
  case -9:
    pcStack_10 = "name too long";
    break;
  case -8:
    pcStack_10 = "file not found";
    break;
  case -7:
    pcStack_10 = "null record";
    break;
  case -6:
    pcStack_10 = "bad checksum";
    break;
  case -5:
    pcStack_10 = "could not seek";
    break;
  case -4:
    pcStack_10 = "could not write";
    break;
  case -3:
    pcStack_10 = "could not read";
    break;
  case -2:
    pcStack_10 = "could not open";
    break;
  case -1:
    pcStack_10 = "failure";
    break;
  default:
    pcStack_10 = "unknown error";
  }
  return pcStack_10;
}

Assistant:

const char* mtar_strerror(int err) {
  switch (err) {
    case MTAR_ESUCCESS     : return "success";
    case MTAR_EFAILURE     : return "failure";
    case MTAR_EOPENFAIL    : return "could not open";
    case MTAR_EREADFAIL    : return "could not read";
    case MTAR_EWRITEFAIL   : return "could not write";
    case MTAR_ESEEKFAIL    : return "could not seek";
    case MTAR_EBADCHKSUM   : return "bad checksum";
    case MTAR_ENULLRECORD  : return "null record";
    case MTAR_ENOTFOUND    : return "file not found";
    case MTAR_ENAMELONG    : return "name too long";
    case MTAR_ETOOLARGE    : return "file too large";
  }
  return "unknown error";
}